

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualMulti.cpp
# Opt level: O2

void __thiscall HDual::major_updateFtranPrepare(HDual *this)

{
  int iVar1;
  HVector *pHVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  HVector_ptr *ppHVar8;
  double dVar9;
  
  HVector::clear(&this->columnBFRT);
  for (lVar7 = 0; uVar4 = (ulong)this->multi_nFinish, lVar7 < (long)uVar4; lVar7 = lVar7 + 1) {
    pHVar2 = this->multi_finish[lVar7].columnBFRT;
    HMatrix::collect_aj(this->matrix,pHVar2,this->multi_finish[lVar7].columnIn,
                        this->multi_finish[lVar7].thetaPrimal);
    lVar3 = lVar7;
    while (lVar6 = lVar3, 0 < lVar6) {
      uVar4 = (ulong)(uint)pHVar2->count;
      if (pHVar2->count < 1) {
        uVar4 = 0;
      }
      dVar9 = 0.0;
      for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
        iVar1 = (pHVar2->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5];
        dVar9 = dVar9 + (pHVar2->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar1] *
                        ((this->multi_finish[lVar6 + -1].row_ep)->array).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar1];
      }
      lVar3 = lVar6 + -1;
      if (1e-14 < ABS(dVar9)) {
        dVar9 = dVar9 / this->multi_finish[lVar6 + -1].alphaRow;
        HMatrix::collect_aj(this->matrix,pHVar2,this->multi_finish[lVar6 + -1].columnIn,-dVar9);
        HMatrix::collect_aj(this->matrix,pHVar2,this->multi_finish[lVar6 + -1].columnOut,dVar9);
      }
    }
    HVector::saxpy(&this->columnBFRT,1.0,pHVar2);
  }
  ppHVar8 = &this->multi_finish[0].column;
  for (lVar7 = 0; lVar7 < (int)uVar4; lVar7 = lVar7 + 1) {
    pHVar2 = *ppHVar8;
    HVector::clear(pHVar2);
    pHVar2->packFlag = true;
    HMatrix::collect_aj(this->matrix,pHVar2,*(int *)(ppHVar8 + -7),1.0);
    uVar4 = (ulong)(uint)this->multi_nFinish;
    ppHVar8 = ppHVar8 + 0xf;
  }
  return;
}

Assistant:

void HDual::major_updateFtranPrepare() {
    // Prepare FTRAN BFRT buffer
    columnBFRT.clear();
    for (int iFn = 0; iFn < multi_nFinish; iFn++) {
        MFinish *Fin = &multi_finish[iFn];
        HVector *Vec = Fin->columnBFRT;
        matrix->collect_aj(*Vec, Fin->columnIn, Fin->thetaPrimal);

        // Update this buffer by previous Row_ep
        for (int jFn = iFn - 1; jFn >= 0; jFn--) {
            MFinish *jFinish = &multi_finish[jFn];
            double *jRow_epArray = &jFinish->row_ep->array[0];
            double pivotX = 0;
            for (int k = 0; k < Vec->count; k++) {
                int iRow = Vec->index[k];
                pivotX += Vec->array[iRow] * jRow_epArray[iRow];
            }
            if (fabs(pivotX) > HSOL_CONST_TINY) {
                pivotX /= jFinish->alphaRow;
                matrix->collect_aj(*Vec, jFinish->columnIn, -pivotX);
                matrix->collect_aj(*Vec, jFinish->columnOut, pivotX);
            }
        }
        columnBFRT.saxpy(1, Vec);
    }

    // Prepare regular FTRAN buffer
    for (int iFn = 0; iFn < multi_nFinish; iFn++) {
        MFinish *iFinish = &multi_finish[iFn];
        HVector *iColumn = iFinish->column;
        iColumn->clear();
        iColumn->packFlag = true;
        matrix->collect_aj(*iColumn, iFinish->columnIn, 1);
    }

}